

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

Pass * wasm::createExtractFunctionPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x30);
  memset(this,0,0x30);
  ExtractFunction::ExtractFunction((ExtractFunction *)this);
  return this;
}

Assistant:

Pass* createExtractFunctionPass() { return new ExtractFunction(); }